

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O1

void __thiscall
CLIntercept::getObjectListString<_cl_semaphore_khr*>
          (CLIntercept *this,cl_uint numObjects,_cl_semaphore_khr **objectList,string *str)

{
  ulong uVar1;
  char s [256];
  char acStack_138 [264];
  
  snprintf(acStack_138,0x100,"( size = %u )[ ",(ulong)numObjects);
  std::__cxx11::string::append((char *)str);
  if (numObjects != 0 && objectList != (_cl_semaphore_khr **)0x0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)str);
      }
      snprintf(acStack_138,0x100,"%p",objectList[uVar1]);
      std::__cxx11::string::append((char *)str);
      uVar1 = uVar1 + 1;
    } while (numObjects != uVar1);
  }
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

void CLIntercept::getObjectListString(
    cl_uint numObjects,
    const T* objectList,
    std::string& str ) const
{
    char    s[256];
    CLI_SPRINTF(s, 256, "( size = %u )[ ", numObjects);
    str += s;

    if( objectList )
    {
        for( cl_uint i = 0; i < numObjects; i++ )
        {
            if( i > 0 )
            {
                str += ", ";
            }
            CLI_SPRINTF( s, 256, "%p", objectList[i] );
            str += s;
        }
    }
    str += " ]";
}